

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lockstep_scheduler_test.cpp
# Opt level: O2

int random_number(int min,int max)

{
  result_type rVar1;
  initializer_list<int> __il;
  default_random_engine engine;
  seed_seq seed;
  uniform_int_distribution<int> distribution;
  
  engine._M_x._0_4_ = random_number::iteration;
  __il._M_len = 1;
  __il._M_array = (iterator)&engine;
  random_number::iteration = random_number::iteration + 1;
  std::seed_seq::seed_seq<int,void>(&seed,__il);
  std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::seed<std::seed_seq>
            (&engine,&seed);
  distribution._M_param._M_a = min;
  distribution._M_param._M_b = max;
  rVar1 = std::uniform_int_distribution<int>::operator()(&distribution,&engine);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&seed);
  return rVar1;
}

Assistant:

int random_number(int min, int max)
{
    // We want predictable test results, so we always
    // start with the seed 0.
    static int iteration = 0;

    std::seed_seq seed{iteration++};
    std::default_random_engine engine{seed};
    std::uniform_int_distribution<> distribution(min, max);

    const int random_number = distribution(engine);
    return random_number;
}